

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::LookupParameters::g_squared_l2norm(LookupParameters *this,float *sqnorm)

{
  bool bVar1;
  reference pvVar2;
  float *in_RSI;
  _Node_const_iterator<unsigned_int,_true,_false> *in_RDI;
  RealScalar RVar3;
  value_type_conflict1 i;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range1;
  real a;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff98;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  _Node_iterator_base<unsigned_int,_false> local_30;
  _Node_iterator_base<unsigned_int,_false> local_28;
  _Node_const_iterator<unsigned_int,_true,_false> *local_20;
  float local_14;
  float *local_10;
  
  local_14 = 0.0;
  local_20 = in_RDI + 0xc;
  local_10 = in_RSI;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::begin(in_stack_ffffffffffffff98);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    pvVar2 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*
                       ((_Node_const_iterator<unsigned_int,_true,_false> *)0x60ef58);
    uVar4 = *pvVar2;
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
              ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 9),(ulong)uVar4);
    Tensor::operator*((Tensor *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
    RVar3 = Eigen::
            MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
            ::squaredNorm(in_stack_ffffffffffffffc0);
    local_14 = RVar3 + local_14;
    std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(in_RDI);
  }
  *local_10 = local_14;
  return;
}

Assistant:

void LookupParameters::g_squared_l2norm(float* sqnorm) const {
#if HAVE_CUDA
  bool acc = false;
  for (auto i : non_zero_grads) {
    gpu::l2_norm_reducer(grads[i].d.size(), grads[i].v, sqnorm, true, acc);
    acc = true;
  }
#else
  real a = 0;
  for (auto i : non_zero_grads)
    a += (*grads[i]).squaredNorm();
  *sqnorm = a;
#endif
}